

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::SourceCodeInfo_Location::ByteSizeLong(SourceCodeInfo_Location *this)

{
  uint uVar1;
  int iVar2;
  RepeatedField<int> *pRVar3;
  size_t sVar4;
  size_t sVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  const_reference value;
  uint32_t *puVar7;
  string *psVar8;
  int local_60;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  SourceCodeInfo_Location *this_;
  SourceCodeInfo_Location *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar3 = _internal_path(this);
  sVar4 = internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar3,1,&(this->field_0)._impl_._path_cached_byte_size_);
  pRVar3 = _internal_span(this);
  sVar5 = internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar3,1,&(this->field_0)._impl_._span_cached_byte_size_);
  pRVar6 = _internal_leading_detached_comments_abi_cxx11_(this);
  iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  _i = internal::FromIntSize(iVar2);
  _i = _i + sVar5 + sVar4;
  local_60 = 0;
  pRVar6 = _internal_leading_detached_comments_abi_cxx11_(this);
  iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar6);
  for (; local_60 < iVar2; local_60 = local_60 + 1) {
    pRVar6 = _internal_leading_detached_comments_abi_cxx11_(this);
    value = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Get(pRVar6,local_60);
    sVar4 = internal::WireFormatLite::StringSize(value);
    _i = sVar4 + _i;
  }
  puVar7 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar7;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar8 = _internal_leading_comments_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar8);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 2) != 0) {
      psVar8 = _internal_trailing_comments_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar8);
      _i = sVar4 + 1 + _i;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,_i,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t SourceCodeInfo_Location::ByteSizeLong() const {
  const SourceCodeInfo_Location& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo.Location)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 path = 1 [packed = true];
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_path(), 1,
              this_._impl_._path_cached_byte_size_);
    }
    // repeated int32 span = 2 [packed = true];
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_span(), 1,
              this_._impl_._span_cached_byte_size_);
    }
    // repeated string leading_detached_comments = 6;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_leading_detached_comments().size());
      for (int i = 0, n = this_._internal_leading_detached_comments().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_leading_detached_comments().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string leading_comments = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_leading_comments());
    }
    // optional string trailing_comments = 4;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_trailing_comments());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}